

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlkem_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_61e64c::MLKEMTest_Iterate1024_Test::TestBody(MLKEMTest_Iterate1024_Test *this)

{
  int iVar1;
  MLKEM1024_private_key *t;
  char *message;
  char *in_R9;
  int iVar2;
  bool bVar3;
  __single_object priv;
  __single_object pub;
  AssertHelper local_1570;
  Message local_1568;
  AssertionResult gtest_ar_;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_priv;
  string local_1538;
  uint8_t result [32];
  uint8_t shared_secret [32];
  uint8_t encap_entropy [32];
  BORINGSSL_keccak_st generate_st;
  uint8_t seed [64];
  BORINGSSL_keccak_st results_st;
  uint8_t invalid_ciphertext [1568];
  uint8_t ciphertext [1568];
  uint8_t kExpected [32];
  
  BORINGSSL_keccak_init(&generate_st,boringssl_shake128);
  BORINGSSL_keccak_init(&results_st,boringssl_shake128);
  std::make_unique<MLKEM1024_private_key>();
  std::make_unique<MLKEM1024_public_key>();
  iVar2 = 10000;
  do {
    bVar3 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar3) {
      BORINGSSL_keccak_squeeze(&results_st,result,0x20);
LAB_002ee250:
      std::unique_ptr<MLKEM1024_public_key,_std::default_delete<MLKEM1024_public_key>_>::~unique_ptr
                (&pub);
      std::unique_ptr<MLKEM1024_private_key,_std::default_delete<MLKEM1024_private_key>_>::
      ~unique_ptr(&priv);
      kExpected[0x10] = 0x82;
      kExpected[0x11] = 0xe6;
      kExpected[0x12] = 0x94;
      kExpected[0x13] = 0xe6;
      kExpected[0x14] = '8';
      kExpected[0x15] = '$';
      kExpected[0x16] = '\x04';
      kExpected[0x17] = 0xab;
      kExpected[0x18] = 0xdb;
      kExpected[0x19] = 0x94;
      kExpected[0x1a] = 0x8b;
      kExpected[0x1b] = 0x90;
      kExpected[0x1c] = 0x8b;
      kExpected[0x1d] = 'u';
      kExpected[0x1e] = 0xba;
      kExpected[0x1f] = 0xd5;
      kExpected[0] = 0xe3;
      kExpected[1] = 0xbf;
      kExpected[2] = 0x82;
      kExpected[3] = 0xb0;
      kExpected[4] = '\x13';
      kExpected[5] = '0';
      kExpected[6] = '{';
      kExpected[7] = '.';
      kExpected[8] = 0x9d;
      kExpected[9] = 'G';
      kExpected[10] = 0xdd;
      kExpected[0xb] = 0xe7;
      kExpected[0xc] = 0x91;
      kExpected[0xd] = 0xff;
      kExpected[0xe] = 'm';
      kExpected[0xf] = 0xfc;
      invalid_ciphertext._0_8_ = result;
      invalid_ciphertext[8] = ' ';
      invalid_ciphertext[9] = '\0';
      invalid_ciphertext[10] = '\0';
      invalid_ciphertext[0xb] = '\0';
      invalid_ciphertext[0xc] = '\0';
      invalid_ciphertext[0xd] = '\0';
      invalid_ciphertext[0xe] = '\0';
      invalid_ciphertext[0xf] = '\0';
      generate_st._0_8_ = kExpected;
      generate_st.state[0] = 0x20;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)ciphertext,"Bytes(result)","Bytes(kExpected)",
                 (Bytes *)invalid_ciphertext,(Bytes *)&generate_st);
      if (ciphertext[0] == '\0') {
        testing::Message::Message((Message *)invalid_ciphertext);
        if (ciphertext._8_8_ == 0) {
          message = "";
        }
        else {
          message = *(char **)ciphertext._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&generate_st,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mlkem/mlkem_test.cc"
                   ,0x210,message);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&generate_st,(Message *)invalid_ciphertext);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&generate_st);
        if (invalid_ciphertext._0_8_ != 0) {
          (**(code **)(*(long *)invalid_ciphertext._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(ciphertext + 8));
      return;
    }
    BORINGSSL_keccak_squeeze(&generate_st,seed,0x40);
    BCM_mlkem1024_generate_key_external_seed
              (kExpected,
               (BCM_mlkem1024_private_key *)
               priv._M_t.
               super___uniq_ptr_impl<MLKEM1024_private_key,_std::default_delete<MLKEM1024_private_key>_>
               ._M_t.
               super__Tuple_impl<0UL,_MLKEM1024_private_key_*,_std::default_delete<MLKEM1024_private_key>_>
               .super__Head_base<0UL,_MLKEM1024_private_key_*,_false>._M_head_impl,seed);
    MLKEM1024_public_from_private
              ((MLKEM1024_public_key *)
               pub._M_t.
               super___uniq_ptr_impl<MLKEM1024_public_key,_std::default_delete<MLKEM1024_public_key>_>
               ._M_t.
               super__Tuple_impl<0UL,_MLKEM1024_public_key_*,_std::default_delete<MLKEM1024_public_key>_>
               .super__Head_base<0UL,_MLKEM1024_public_key_*,_false>._M_head_impl,
               (MLKEM1024_private_key *)
               priv._M_t.
               super___uniq_ptr_impl<MLKEM1024_private_key,_std::default_delete<MLKEM1024_private_key>_>
               ._M_t.
               super__Tuple_impl<0UL,_MLKEM1024_private_key_*,_std::default_delete<MLKEM1024_private_key>_>
               .super__Head_base<0UL,_MLKEM1024_private_key_*,_false>._M_head_impl);
    BORINGSSL_keccak_absorb(&results_st,kExpected,0x620);
    Marshal<MLKEM1024_private_key>
              (&encoded_priv,
               (_func_int_CBB_ptr_MLKEM1024_private_key_ptr *)
               priv._M_t.
               super___uniq_ptr_impl<MLKEM1024_private_key,_std::default_delete<MLKEM1024_private_key>_>
               ._M_t.
               super__Tuple_impl<0UL,_MLKEM1024_private_key_*,_std::default_delete<MLKEM1024_private_key>_>
               .super__Head_base<0UL,_MLKEM1024_private_key_*,_false>._M_head_impl,t);
    BORINGSSL_keccak_absorb
              (&results_st,
               encoded_priv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (long)encoded_priv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)encoded_priv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
    BORINGSSL_keccak_squeeze(&generate_st,encap_entropy,0x20);
    BCM_mlkem1024_encap_external_entropy
              (ciphertext,shared_secret,
               (BCM_mlkem1024_public_key *)
               pub._M_t.
               super___uniq_ptr_impl<MLKEM1024_public_key,_std::default_delete<MLKEM1024_public_key>_>
               ._M_t.
               super__Tuple_impl<0UL,_MLKEM1024_public_key_*,_std::default_delete<MLKEM1024_public_key>_>
               .super__Head_base<0UL,_MLKEM1024_public_key_*,_false>._M_head_impl,encap_entropy);
    BORINGSSL_keccak_absorb(&results_st,ciphertext,0x620);
    BORINGSSL_keccak_absorb(&results_st,shared_secret,0x20);
    BORINGSSL_keccak_squeeze(&generate_st,invalid_ciphertext,0x620);
    iVar1 = MLKEM1024_decap(shared_secret,invalid_ciphertext,0x620,
                            (MLKEM1024_private_key *)
                            priv._M_t.
                            super___uniq_ptr_impl<MLKEM1024_private_key,_std::default_delete<MLKEM1024_private_key>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_MLKEM1024_private_key_*,_std::default_delete<MLKEM1024_private_key>_>
                            .super__Head_base<0UL,_MLKEM1024_private_key_*,_false>._M_head_impl);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar1 != 0;
    if (iVar1 == 0) {
      testing::Message::Message(&local_1568);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_1538,(internal *)&gtest_ar_,
                 (AssertionResult *)
                 "DECAP(shared_secret, invalid_ciphertext, sizeof(invalid_ciphertext), priv.get())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1570,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mlkem/mlkem_test.cc"
                 ,0x1e2,local_1538._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_1570,&local_1568);
      testing::internal::AssertHelper::~AssertHelper(&local_1570);
      std::__cxx11::string::~string((string *)&local_1538);
      if (local_1568.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
          (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)local_1568.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&encoded_priv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      goto LAB_002ee250;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    BORINGSSL_keccak_absorb(&results_st,shared_secret,0x20);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&encoded_priv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  } while( true );
}

Assistant:

TEST(MLKEMTest, Iterate1024) {
  // The structure of this test is taken from
  // https://github.com/C2SP/CCTV/blob/main/ML-KEM/README.md?ref=words.filippo.io#accumulated-pq-crystals-vectors
  // but the final value has been updated to reflect the change from Kyber to
  // ML-KEM.
  uint8_t result[32];
  IteratedTest<MLKEM1024_public_key, MLKEM1024_PUBLIC_KEY_BYTES,
               MLKEM1024_private_key, BCM_MLKEM1024_PRIVATE_KEY_BYTES,
               wrapper_1024_generate_key_external_seed,
               MLKEM1024_public_from_private, wrapper_1024_marshal_private_key,
               MLKEM1024_CIPHERTEXT_BYTES, wrapper_1024_encap_external_entropy,
               MLKEM1024_decap>(result);

  const uint8_t kExpected[32] = {
      0xe3, 0xbf, 0x82, 0xb0, 0x13, 0x30, 0x7b, 0x2e, 0x9d, 0x47, 0xdd,
      0xe7, 0x91, 0xff, 0x6d, 0xfc, 0x82, 0xe6, 0x94, 0xe6, 0x38, 0x24,
      0x04, 0xab, 0xdb, 0x94, 0x8b, 0x90, 0x8b, 0x75, 0xba, 0xd5};
  EXPECT_EQ(Bytes(result), Bytes(kExpected));
}